

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::VarExpr<(wabt::ExprType)9>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)9>_>_>
 __thiscall wabt::MakeUnique<wabt::VarExpr<(wabt::ExprType)9>,wabt::Var>(wabt *this,Var *args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x88);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *(undefined8 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 9;
  *puVar1 = &PTR__VarExpr_01544c50;
  Var::Var((Var *)(puVar1 + 8),args);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)9>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)9>_>,_true,_true>
          )(__uniq_ptr_data<wabt::VarExpr<(wabt::ExprType)9>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)9>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}